

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateFixed(LodePNGBitWriter *writer,Hash *hash,uchar *data,size_t datapos,size_t dataend,
                 LodePNGCompressSettings *settings,uint final)

{
  ulong in_RCX;
  uchar *in_RDX;
  Hash *in_RSI;
  uivector *in_RDI;
  size_t in_R8;
  long in_R9;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uivector lz77_encoded;
  size_t i;
  uint error;
  uint BFINAL;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  LodePNGBitWriter *in_stack_ffffffffffffff50;
  HuffmanTree *in_stack_ffffffffffffff58;
  HuffmanTree *in_stack_ffffffffffffff60;
  uivector *in_stack_ffffffffffffff68;
  LodePNGBitWriter *in_stack_ffffffffffffff70;
  uint local_88;
  HuffmanTree local_80;
  HuffmanTree local_58;
  
  HuffmanTree_init(&local_58);
  HuffmanTree_init(&local_80);
  local_88 = generateFixedLitLenTree
                       ((HuffmanTree *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                       );
  if (local_88 == 0) {
    local_88 = generateFixedDistanceTree
                         ((HuffmanTree *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  if (local_88 == 0) {
    writeBits(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    writeBits(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    writeBits(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (*(int *)(in_R9 + 4) == 0) {
      for (; in_RCX < in_R8; in_RCX = in_RCX + 1) {
        writeBitsReversed(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
    }
    else {
      uivector_init((uivector *)&stack0xffffffffffffff58);
      in_stack_ffffffffffffff40 = *(undefined4 *)(in_R9 + 0x10);
      local_88 = encodeLZ77(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,(uint)((ulong)in_R9 >> 0x20),
                            in_stack_00000010,in_stack_00000018,(uint)lz77_encoded.data);
      if (local_88 == 0) {
        writeLZ77data(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff58);
      }
      uivector_cleanup((void *)0x1d0137);
    }
    if (local_88 == 0) {
      writeBitsReversed(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
  }
  HuffmanTree_cleanup((HuffmanTree *)0x1d01e0);
  HuffmanTree_cleanup((HuffmanTree *)0x1d01ea);
  return local_88;
}

Assistant:

static unsigned deflateFixed(LodePNGBitWriter* writer, Hash* hash,
                             const unsigned char* data,
                             size_t datapos, size_t dataend,
                             const LodePNGCompressSettings* settings, unsigned final) {
  HuffmanTree tree_ll; /*tree for literal values and length codes*/
  HuffmanTree tree_d; /*tree for distance codes*/

  unsigned BFINAL = final;
  unsigned error = 0;
  size_t i;

  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);

  error = generateFixedLitLenTree(&tree_ll);
  if(!error) error = generateFixedDistanceTree(&tree_d);

  if(!error) {
    writeBits(writer, BFINAL, 1);
    writeBits(writer, 1, 1); /*first bit of BTYPE*/
    writeBits(writer, 0, 1); /*second bit of BTYPE*/

    if(settings->use_lz77) /*LZ77 encoded*/ {
      uivector lz77_encoded;
      uivector_init(&lz77_encoded);
      error = encodeLZ77(&lz77_encoded, hash, data, datapos, dataend, settings->windowsize,
                         settings->minmatch, settings->nicematch, settings->lazymatching);
      if(!error) writeLZ77data(writer, &lz77_encoded, &tree_ll, &tree_d);
      uivector_cleanup(&lz77_encoded);
    } else /*no LZ77, but still will be Huffman compressed*/ {
      for(i = datapos; i < dataend; ++i) {
        writeBitsReversed(writer, tree_ll.codes[data[i]], tree_ll.lengths[data[i]]);
      }
    }
    /*add END code*/
    if(!error) writeBitsReversed(writer,tree_ll.codes[256], tree_ll.lengths[256]);
  }

  /*cleanup*/
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);

  return error;
}